

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitB(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  long in_RSI;
  PtexSeparableKernel *in_RDI;
  int w;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe8;
  Res RVar2;
  long lVar3;
  
  iVar1 = -in_RDI->v;
  if (iVar1 < in_RDI->vw) {
    RVar2 = in_RDI->res;
    lVar3 = in_RSI;
    Res::v(&in_RDI->res);
    set((PtexSeparableKernel *)((ulong)in_stack_ffffffffffffffcc << 0x20),
        SUB82((ulong)in_RSI >> 0x30,0),(int)((ulong)in_RDI->kv >> 0x20),(int)in_RDI->kv,
        (int)((ulong)in_RDI->ku >> 0x20),(int)in_RDI->ku,(float *)in_RDI,
        (float *)CONCAT44(iVar1,CONCAT22(RVar2,in_stack_ffffffffffffffe8)),(int)lVar3);
    in_RDI->v = 0;
    in_RDI->vw = in_RDI->vw - iVar1;
    in_RDI->kv = in_RDI->kv + iVar1;
  }
  else {
    operator=(in_RDI,(PtexSeparableKernel *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar1 = Res::v(&in_RDI->res);
    *(int *)(in_RSI + 8) = iVar1 + *(int *)(in_RSI + 8);
    in_RDI->v = 0;
    in_RDI->vw = 0;
  }
  return;
}

Assistant:

void splitB(PtexSeparableKernel& k)
    {
        // split off bottom piece of width w into k
        int w = -v;
        if (w < vw) {
            // normal case - split off a portion
            //    res  u  v          uw vw  ku  kv
            k.set(res, u, res.v()-w, uw, w, ku, kv);

            // update local
            v = 0;
            vw -= w;
            kv += w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.v += res.v();
            v = 0; vw = 0;
        }
    }